

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O2

Vec_Vec_t * Saig_ManCexMinCollectPhasePriority(Aig_Man_t *pAig,Abc_Cex_t *pCex,Vec_Vec_t *vFrameCis)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  Vec_Vec_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Aig_Obj_t *pAVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  
  for (iVar8 = 0; iVar8 < pAig->vObjs->nSize; iVar8 = iVar8 + 1) {
    pvVar6 = Vec_PtrEntry(pAig->vObjs,iVar8);
    if (pvVar6 != (void *)0x0) {
      *(undefined4 *)((long)pvVar6 + 0x28) = 0xffffffff;
    }
  }
  p = Vec_VecStart(pCex->iFrame + 1);
  iVar8 = pCex->nRegs;
  iVar10 = (pCex->iFrame + 1) * pCex->nPis + iVar8;
  iVar2 = Abc_Var2Lit(iVar10,1);
  (pAig->pConst1->field_5).iData = iVar2;
  p_00 = Vec_IntAlloc(iVar10);
  iVar2 = 0;
  while( true ) {
    if (pCex->iFrame < iVar2) {
      Vec_IntFree(p_00);
      pAVar7 = Aig_ManCo(pAig,pCex->iPo);
      iVar8 = Abc_LitIsCompl((pAVar7->field_5).iData);
      if (iVar8 != 0) {
        return p;
      }
      __assert_fail("Abc_LitIsCompl(pObj->iData)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                    ,0x15c,
                    "Vec_Vec_t *Saig_ManCexMinCollectPhasePriority(Aig_Man_t *, Abc_Cex_t *, Vec_Vec_t *)"
                   );
    }
    p_01 = Vec_VecEntryInt(vFrameCis,iVar2);
    p_02 = Vec_VecEntryInt(p,iVar2);
    if (p_02->nSize != 0) break;
    uVar9 = 0;
    for (iVar10 = 0; iVar10 < p_01->nSize; iVar10 = iVar10 + 1) {
      iVar3 = Vec_IntEntry(p_01,iVar10);
      pAVar7 = Aig_ManObj(pAig,iVar3);
      if ((*(uint *)&pAVar7->field_0x18 & 7) != 2) {
        __assert_fail("Aig_ObjIsCi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                      ,0x14e,
                      "Vec_Vec_t *Saig_ManCexMinCollectPhasePriority(Aig_Man_t *, Abc_Cex_t *, Vec_Vec_t *)"
                     );
      }
      iVar3 = Saig_ObjIsPi(pAig,pAVar7);
      if (iVar3 == 0) {
        if (iVar2 == 0) {
          iVar3 = Saig_ObjRegId(pAig,pAVar7);
          iVar3 = Abc_Var2Lit(iVar3,0);
        }
        else {
          pAVar7 = Saig_ObjLoToLi(pAig,pAVar7);
          iVar3 = (pAVar7->field_5).iData;
        }
      }
      else {
        iVar3 = pCex->nPis;
        iVar1 = pCex->nRegs;
        iVar4 = Aig_ObjCioId(pAVar7);
        uVar5 = iVar4 + iVar3 * iVar2 + iVar1;
        iVar3 = Abc_Var2Lit(~uVar9 + iVar8 + iVar3 * (iVar2 + 1),
                            (uint)(((uint)(&pCex[1].iPo)[(int)uVar5 >> 5] >> (uVar5 & 0x1f) & 1) !=
                                  0));
        uVar9 = uVar9 + 1;
      }
      Vec_IntPush(p_02,iVar3);
    }
    Saig_ManCexMinDerivePhasePriority(pAig,pCex,vFrameCis,p,iVar2,p_00);
    iVar2 = iVar2 + 1;
  }
  __assert_fail("Vec_IntSize(vFramePPsOne) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                ,0x14b,
                "Vec_Vec_t *Saig_ManCexMinCollectPhasePriority(Aig_Man_t *, Abc_Cex_t *, Vec_Vec_t *)"
               );
}

Assistant:

Vec_Vec_t * Saig_ManCexMinCollectPhasePriority( Aig_Man_t * pAig, Abc_Cex_t * pCex, Vec_Vec_t * vFrameCis )
{
    Vec_Vec_t * vFramePPs;
    Vec_Int_t * vRoots, * vFramePPsOne, * vFrameCisOne;
    Aig_Obj_t * pObj;
    int i, f, nPrioOffset;

    // initialize phase and priority
    Aig_ManForEachObj( pAig, pObj, i )
        pObj->iData = -1;

    // set the constant node to higher priority than the flops
    vFramePPs = Vec_VecStart( pCex->iFrame+1 );
    nPrioOffset = pCex->nRegs;
    Aig_ManConst1(pAig)->iData = Abc_Var2Lit( nPrioOffset + (pCex->iFrame + 1) * pCex->nPis, 1 );
    vRoots = Vec_IntAlloc( 1000 );
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        int nPiCount = 0;
        // fill in PP for the CIs
        vFrameCisOne = Vec_VecEntryInt( vFrameCis, f );
        vFramePPsOne = Vec_VecEntryInt( vFramePPs, f );
        assert( Vec_IntSize(vFramePPsOne) == 0 );
        Aig_ManForEachObjVec( vFrameCisOne, pAig, pObj, i )
        {
            assert( Aig_ObjIsCi(pObj) );
            if ( Saig_ObjIsPi(pAig, pObj) )
                Vec_IntPush( vFramePPsOne, Abc_Var2Lit( nPrioOffset + (f+1) * pCex->nPis - 1 - nPiCount++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + f * pCex->nPis + Aig_ObjCioId(pObj)) ) );
            else if ( f == 0 )
                Vec_IntPush( vFramePPsOne, Abc_Var2Lit( Saig_ObjRegId(pAig, pObj), 0 ) );
            else
                Vec_IntPush( vFramePPsOne, Saig_ObjLoToLi(pAig, pObj)->iData );
        }
        // compute the PP info
        Saig_ManCexMinDerivePhasePriority( pAig, pCex, vFrameCis, vFramePPs, f, vRoots );
    }
    Vec_IntFree( vRoots );
    // check the output
    pObj = Aig_ManCo( pAig, pCex->iPo );
    assert( Abc_LitIsCompl(pObj->iData) );
    return vFramePPs;
}